

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_test.cxx
# Opt level: O2

int serialization_test::srv_config_test(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int32 args;
  ostream *poVar5;
  int iVar6;
  hash<std::thread::id> local_101;
  ptr<srv_config> srv_conf1;
  ptr<srv_config> srv_conf;
  string _v;
  ptr<buffer> srv_conf_buf;
  char *local_b0 [4];
  id local_90;
  string _ev;
  
  local_b0[0]._0_4_ = rnd();
  args = rnd();
  _v._M_dataplus._M_p = nuraft::strfmt<100>::fmt<int>((strfmt<100> *)&_ev,args);
  std::make_shared<nuraft::srv_config,int,char_const*>((int *)&srv_conf,local_b0);
  nuraft::srv_config::serialize((srv_config *)&srv_conf_buf);
  nuraft::srv_config::deserialize
            ((srv_config *)&srv_conf1,
             srv_conf_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string
            ((string *)&_ev,
             (string *)
             &(srv_conf.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              endpoint_);
  std::__cxx11::string::string
            ((string *)&_v,
             (string *)
             &(srv_conf1.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->endpoint_);
  bVar4 = std::operator!=(&_ev,&_v);
  if (bVar4) {
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar5 = std::operator<<(poVar5,"        time: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,(string *)local_b0);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"      thread: ");
    poVar5 = std::operator<<(poVar5,"\x1b[33m");
    lVar2 = *(long *)poVar5;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar5 + lVar3 + 0x18) = *(uint *)(poVar5 + lVar3 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
    poVar5 = std::operator<<(poVar5,0x30);
    local_90._M_thread = pthread_self();
    std::hash<std::thread::id>::operator()(&local_101,&local_90);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          in: ");
    poVar5 = std::operator<<(poVar5,"\x1b[36m");
    poVar5 = std::operator<<(poVar5,"srv_config_test");
    poVar5 = std::operator<<(poVar5,"()\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          at: ");
    poVar5 = std::operator<<(poVar5,"\x1b[32m");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/serialization_test.cxx"
                            );
    poVar5 = std::operator<<(poVar5,"\x1b[0m:");
    poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x38);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34msrv_conf1->get_endpoint()\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
    poVar5 = std::operator<<(poVar5,(string *)&_ev);
    poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
    poVar5 = std::operator<<(poVar5,(string *)&_v);
    std::operator<<(poVar5,"\x1b[0m\n");
    std::__cxx11::string::~string((string *)local_b0);
    TestSuite::failHandler();
    std::__cxx11::string::~string((string *)&_v);
    std::__cxx11::string::~string((string *)&_ev);
    iVar6 = -1;
  }
  else {
    std::__cxx11::string::~string((string *)&_v);
    std::__cxx11::string::~string((string *)&_ev);
    iVar6 = (srv_conf.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            id_;
    iVar1 = (srv_conf1.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            id_;
    if (iVar6 != iVar1) {
      poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar5 = std::operator<<(poVar5,"        time: ");
      poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,(string *)&_ev);
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"      thread: ");
      poVar5 = std::operator<<(poVar5,"\x1b[33m");
      lVar2 = *(long *)poVar5;
      lVar3 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar5 + lVar3 + 0x18) = *(uint *)(poVar5 + lVar3 + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
      poVar5 = std::operator<<(poVar5,0x30);
      _v._M_dataplus._M_p = (pointer)pthread_self();
      std::hash<std::thread::id>::operator()((hash<std::thread::id> *)local_b0,(id *)&_v);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"          in: ");
      poVar5 = std::operator<<(poVar5,"\x1b[36m");
      poVar5 = std::operator<<(poVar5,"srv_config_test");
      poVar5 = std::operator<<(poVar5,"()\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"          at: ");
      poVar5 = std::operator<<(poVar5,"\x1b[32m");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/serialization_test.cxx"
                              );
      poVar5 = std::operator<<(poVar5,"\x1b[0m:");
      poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x39);
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34msrv_conf1->get_id()\x1b[0m\n");
      poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar6);
      poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
      poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar1);
      std::operator<<(poVar5,"\x1b[0m\n");
      std::__cxx11::string::~string((string *)&_ev);
      TestSuite::failHandler();
    }
    iVar6 = -(uint)(iVar6 != iVar1);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&srv_conf1.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&srv_conf_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&srv_conf.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return iVar6;
}

Assistant:

int srv_config_test() {
    ptr<srv_config> srv_conf
                    ( cs_new<srv_config>
                      ( rnd(),
                        sstrfmt("server %d").fmt( rnd() ) ) );
    ptr<buffer> srv_conf_buf( srv_conf->serialize() );

    ptr<srv_config> srv_conf1( srv_config::deserialize(*srv_conf_buf) );

    CHK_EQ( srv_conf->get_endpoint(), srv_conf1->get_endpoint() );
    CHK_EQ( srv_conf->get_id(), srv_conf1->get_id() );

    return 0;
}